

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O0

void pele::physics::turbinflow::TurbInflow::read_one_turb_plane(TurbParm *a_tp,int iplane,int k)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  Box *pBVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  Box srcBox;
  FArrayBox tmp;
  long start;
  long offset_idx;
  int n;
  Box dstBox;
  ifstream ifs;
  int in_stack_00000140;
  string turb_data;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined6 in_stack_fffffffffffffce8;
  FArrayBox *this;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  DataAllocator in_stack_fffffffffffffd20;
  double *in_stack_fffffffffffffd28;
  int local_290;
  Box local_28c;
  string local_270 [48];
  undefined1 local_240 [180];
  int in_stack_fffffffffffffe74;
  Box *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  Box *in_stack_fffffffffffffe88;
  BaseFab<double> *in_stack_fffffffffffffe90;
  BaseFab<double> *in_stack_fffffffffffffe98;
  undefined1 local_38 [56];
  
  this = (FArrayBox *)local_38;
  local_38._32_4_ = in_EDX;
  local_38._36_4_ = in_ESI;
  local_38._40_8_ = in_RDI;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_240,pcVar3,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+((char *)in_stack_fffffffffffffd28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd20.m_arena);
    amrex::Abort((string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_270);
  }
  pBVar4 = amrex::BaseFab<double>::box(*(BaseFab<double> **)(local_38._40_8_ + 0xa8));
  local_28c.smallend.vect._0_8_ = *(undefined8 *)(pBVar4->smallend).vect;
  local_28c._8_8_ = *(undefined8 *)((pBVar4->smallend).vect + 2);
  local_28c.bigend.vect._4_8_ = *(undefined8 *)((pBVar4->bigend).vect + 1);
  local_28c.btype.itype = (pBVar4->btype).itype;
  amrex::Box::setSmall(&local_28c,2,local_38._36_4_);
  amrex::Box::setBig(&local_28c,2,local_38._36_4_);
  for (local_290 = 0; local_290 < 3; local_290 = local_290 + 1) {
    std::istream::seekg((long)local_240,
                        (_Ios_Seekdir)
                        *(undefined8 *)
                         (*(long *)(local_38._40_8_ + 0x100) +
                         (long)(local_38._32_4_ + 1 + local_290 * *(int *)(local_38._40_8_ + 0xf8))
                         * 8));
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      local_38._48_8_ = "getplane(): seekg() failed";
      amrex::Abort_host((char *)this);
    }
    amrex::FArrayBox::FArrayBox((FArrayBox *)&stack0xfffffffffffffd18);
    amrex::FArrayBox::readFrom
              (this,(istream *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_fffffffffffffce8)));
    amrex::BaseFab<double>::box((BaseFab<double> *)&stack0xfffffffffffffd18);
    amrex::BaseFab<double>::copy<(amrex::RunOn)0>
              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
               in_stack_00000140);
    amrex::FArrayBox::~FArrayBox((FArrayBox *)0x10d8717);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_240);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
TurbInflow::read_one_turb_plane(TurbParm& a_tp, int iplane, int k)
{
  // There are AMREX_SPACEDIM * kmax planes of FABs.
  // The first component are in the first kmax planes,
  // the second component in the next kmax planes, ....
  // Note also that both (*plane) and (*ncomp) start from
  // 1 not 0 since they're passed from Fortran.

  std::string turb_data = a_tp.m_turb_file + "/DAT";
  std::ifstream ifs(turb_data.c_str());
  if (!ifs.is_open()) {
    amrex::Abort("Unable to open input file " + turb_data);
  }

  amrex::Box dstBox = a_tp.sdata->box();
  dstBox.setSmall(2, iplane);
  dstBox.setBig(2, iplane);

  for (int n = 0; n < AMREX_SPACEDIM; ++n) {

    const long offset_idx = (k + 1) + (n * a_tp.kmax);
    AMREX_ASSERT_WITH_MESSAGE(
      offset_idx < a_tp.offset_size, "Bad turb fab offset idx");

    const long start = a_tp.offset[offset_idx];

    ifs.seekg(start, std::ios::beg);

    if (!ifs.good()) {
      amrex::Abort("getplane(): seekg() failed");
    }

    amrex::FArrayBox tmp;
    tmp.readFrom(ifs);
    amrex::Box srcBox = tmp.box();

    a_tp.sdata->copy<amrex::RunOn::Device>(tmp, srcBox, 0, dstBox, n, 1);
  }
  ifs.close();
}